

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_schema.c
# Opt level: O0

LY_ERR lys_print_clb(ly_write_clb writeclb,void *user_data,lys_module *module,LYS_OUTFORMAT format,
                    uint32_t options)

{
  ly_out *plStack_38;
  LY_ERR ret__;
  ly_out *out;
  uint32_t options_local;
  LYS_OUTFORMAT format_local;
  lys_module *module_local;
  void *user_data_local;
  ly_write_clb writeclb_local;
  
  out._0_4_ = options;
  out._4_4_ = format;
  _options_local = module;
  module_local = (lys_module *)user_data;
  user_data_local = writeclb;
  if (writeclb == (ly_write_clb)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","writeclb","lys_print_clb"
          );
    writeclb_local._4_4_ = LY_EINVAL;
  }
  else if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","module","lys_print_clb");
    writeclb_local._4_4_ = LY_EINVAL;
  }
  else {
    writeclb_local._4_4_ = ly_out_new_clb(writeclb,user_data,&stack0xffffffffffffffc8);
    if (writeclb_local._4_4_ == LY_SUCCESS) {
      writeclb_local._4_4_ = lys_print_(plStack_38,_options_local,out._4_4_,(uint32_t)out);
    }
  }
  return writeclb_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_print_clb(ly_write_clb writeclb, void *user_data, const struct lys_module *module, LYS_OUTFORMAT format, uint32_t options)
{
    struct ly_out *out;

    LY_CHECK_ARG_RET(NULL, writeclb, module, LY_EINVAL);

    LY_CHECK_RET(ly_out_new_clb(writeclb, user_data, &out));
    return lys_print_(out, module, format, options);
}